

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O2

void __thiscall
amrex::EB2::Level::fillAreaFrac(Level *this,Array<MultiFab_*,_3> *a_areafrac,Geometry *geom)

{
  int num_comp;
  FabArray<amrex::FArrayBox> *this_00;
  element_type *peVar1;
  FArrayBox *pFVar2;
  uint uVar3;
  undefined8 uVar4;
  pointer ppVar5;
  pointer pIVar6;
  int i;
  int iVar7;
  pointer ppVar8;
  int *piVar9;
  int idim_1;
  pointer v;
  int idim;
  long lVar10;
  FabArray<amrex::FArrayBox> *pFVar11;
  Box r;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box bx;
  Box r_1;
  _Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_168;
  MFIter mfi;
  Array4<double> local_f0;
  Array4<double> local_b0;
  Array4<double> local_70;
  
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&a_areafrac->_M_elems[lVar10]->super_FabArray<amrex::FArrayBox>,1.0);
  }
  if (this->m_allregular == false) {
    pFVar11 = (FabArray<amrex::FArrayBox> *)&this->m_areafrac;
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      this_00 = &a_areafrac->_M_elems[lVar10]->super_FabArray<amrex::FArrayBox>;
      iVar7 = (this_00->super_FabArrayBase).n_grow.vect[0];
      num_comp = (this_00->super_FabArrayBase).n_comp;
      mfi._0_12_ = Geometry::periodicity(geom);
      FabArray<amrex::FArrayBox>::ParallelCopy
                (this_00,pFVar11,0,0,num_comp,0,iVar7,(Periodicity *)&mfi,COPY);
      pFVar11 = pFVar11 + 1;
    }
    mfi._0_12_ = Geometry::periodicity(geom);
    Periodicity::shiftIntVect
              ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&local_168,
               (Periodicity *)&mfi);
    peVar1 = (this->m_covered_grids).m_ref.
             super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        *(pointer *)
         ((long)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data + 8)) {
      isects.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      isects.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      isects.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MFIter::MFIter(&mfi,(FabArrayBase *)a_areafrac->_M_elems[0],'\0');
      while( true ) {
        if (mfi.endIndex <= mfi.currentIndex) break;
        iVar7 = mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          iVar7 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[mfi.currentIndex];
        }
        pFVar11 = &a_areafrac->_M_elems[0]->super_FabArray<amrex::FArrayBox>;
        pFVar2 = (pFVar11->m_fabs_v).
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[iVar7];
        bx.smallend.vect._0_8_ = *(undefined8 *)(pFVar2->super_BaseFab<double>).domain.smallend.vect
        ;
        uVar4 = *(undefined8 *)((long)&(pFVar2->super_BaseFab<double>).domain.smallend + 8);
        bx.bigend.vect[1] =
             (int)((ulong)*(undefined8 *)(pFVar2->super_BaseFab<double>).domain.bigend.vect >> 0x20)
        ;
        bx._20_8_ = *(undefined8 *)((long)&(pFVar2->super_BaseFab<double>).domain.bigend + 8);
        bx.smallend.vect[2] = (int)uVar4;
        bx.bigend.vect[0] = (int)((ulong)uVar4 >> 0x20);
        for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
          if ((bx.btype.itype >> ((uint)lVar10 & 0x1f) & 1) != 0) {
            piVar9 = bx.bigend.vect + lVar10;
            *piVar9 = *piVar9 + -1;
          }
        }
        bx._20_8_ = bx._20_8_ & 0xffffffff;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_70,pFVar11,&mfi);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_b0,&a_areafrac->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&mfi);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_f0,&a_areafrac->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&mfi);
        pIVar6 = local_168._M_impl.super__Vector_impl_data._M_finish;
        for (v = local_168._M_impl.super__Vector_impl_data._M_start; v != pIVar6; v = v + 1) {
          r.bigend.vect[1] = bx.bigend.vect[1];
          r.bigend.vect[2] = bx.bigend.vect[2];
          r.btype.itype = bx.btype.itype;
          r.smallend.vect[0] = bx.smallend.vect[0];
          r.smallend.vect[1] = bx.smallend.vect[1];
          r.smallend.vect[2] = bx.smallend.vect[2];
          r.bigend.vect[0] = bx.bigend.vect[0];
          Box::operator+=(&r,v);
          BoxArray::intersections(&this->m_covered_grids,&r,&isects);
          ppVar5 = isects.
                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar8 = isects.
                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar5;
              ppVar8 = ppVar8 + 1) {
            for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
              r_1.smallend.vect._0_8_ = *(undefined8 *)(ppVar8->second).smallend.vect;
              uVar4 = *(undefined8 *)((ppVar8->second).smallend.vect + 2);
              r_1._20_8_ = *(undefined8 *)((ppVar8->second).bigend.vect + 2);
              r_1.bigend.vect[1] = (int)((ulong)*(undefined8 *)(ppVar8->second).bigend.vect >> 0x20)
              ;
              r_1.smallend.vect[2] = (int)uVar4;
              r_1.bigend.vect[0] = (int)((ulong)uVar4 >> 0x20);
              Box::operator-=(&r_1,v);
              r.bigend.vect[1] = r_1.bigend.vect[1];
              r.bigend.vect[2] = r_1.bigend.vect[2];
              r.btype.itype = r_1.btype.itype;
              uVar4 = r._20_8_;
              r.smallend.vect[0] = r_1.smallend.vect[0];
              r.smallend.vect[1] = r_1.smallend.vect[1];
              r.smallend.vect[2] = r_1.smallend.vect[2];
              r.bigend.vect[0] = r_1.bigend.vect[0];
              r.btype.itype = r_1.btype.itype;
              uVar3 = r.btype.itype >> ((uint)lVar10 & 0x1f);
              r._20_8_ = uVar4;
              if ((uVar3 & 1) == 0) {
                piVar9 = r.bigend.vect + lVar10;
                *piVar9 = *piVar9 + 1;
                r.btype.itype = r.btype.itype | 1 << ((byte)lVar10 & 0x1f);
              }
              piVar9 = &mfi.currentIndex;
              if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                piVar9 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + mfi.currentIndex;
              }
              r_1.smallend.vect[0] = 0;
              r_1.smallend.vect[1] = 0;
              BaseFab<double>::setVal<(amrex::RunOn)1>
                        (&(a_areafrac->_M_elems[lVar10]->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                          super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[*piVar9]->super_BaseFab<double>,
                         (double *)&r_1,&r,(DestComp)0x0,(NumComps)0x1);
            }
          }
        }
        MFIter::operator++(&mfi);
      }
      MFIter::~MFIter(&mfi);
      std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
      ~_Vector_base(&isects.
                     super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                   );
    }
    std::_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~_Vector_base(&local_168);
  }
  return;
}

Assistant:

void
Level::fillAreaFrac (Array<MultiFab*,AMREX_SPACEDIM> const& a_areafrac, const Geometry& geom) const
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        a_areafrac[idim]->setVal(1.0);
    }

    if (isAllRegular()) return;

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        auto& areafrac = *a_areafrac[idim];
        areafrac.ParallelCopy(m_areafrac[idim],0,0,areafrac.nComp(),
                              0,areafrac.nGrow(),geom.periodicity());
    }

    const std::vector<IntVect>& pshifts = geom.periodicity().shiftIntVect();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    if (!m_covered_grids.empty())
    {
        std::vector<std::pair<int,Box> > isects;
        for (MFIter mfi(*a_areafrac[0]); mfi.isValid(); ++mfi)
        {
            const Box& ccbx = amrex::enclosedCells((*a_areafrac[0])[mfi].box());
            AMREX_D_TERM(auto const& apx = a_areafrac[0]->array(mfi);,
                         auto const& apy = a_areafrac[1]->array(mfi);,
                         auto const& apz = a_areafrac[2]->array(mfi););
            for (const auto& iv : pshifts)
            {
                m_covered_grids.intersections(ccbx+iv, isects);
                for (const auto& is : isects) {
                    if (Gpu::inLaunchRegion()) {
                        const Box& bx = is.second-iv;
                        AMREX_D_TERM(const Box& xbx = amrex::surroundingNodes(bx,0);,
                                     const Box& ybx = amrex::surroundingNodes(bx,1);,
                                     const Box& zbx = amrex::surroundingNodes(bx,2););
                        amrex::ParallelFor(AMREX_D_DECL(xbx,ybx,zbx),
                          [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                          {
                              apx(i,j,k) = 0.0;
                          }
#if (AMREX_SPACEDIM >= 2)
                        , [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                          {
                              apy(i,j,k) = 0.0;
                          }
#if (AMREX_SPACEDIM == 3)
                        , [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                          {
                              apz(i,j,k) = 0.0;
                          }
#endif
#endif
                        );
                    } else {
                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                            const Box& fbx = amrex::surroundingNodes(is.second-iv,idim);
                            (*a_areafrac[idim])[mfi].setVal<RunOn::Host>(0.0, fbx, 0, 1);
                        }
                    }
                }
            }
        }
    }
}